

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

void __thiscall CppGenerator::createGroupVariableOrder(CppGenerator *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  bool bVar5;
  size_type sVar6;
  ulong uVar7;
  size_type *psVar8;
  reference pvVar9;
  reference ppAVar10;
  size_t sVar11;
  reference pvVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar13;
  View *pVVar14;
  void *__s;
  long in_RDI;
  ulong uVar15;
  reference rVar16;
  CppGenerator *in_stack_00000140;
  size_t var_3;
  var_bitset intersection;
  size_t orderIdx;
  bool hash;
  View *view_1;
  size_t viewID_1;
  size_t *off_1;
  size_t idx_1;
  size_t var_2;
  var_bitset *viewFVars;
  size_t incViewID_1;
  size_t *off;
  size_t idx;
  size_t var_1;
  size_t var;
  size_t *incViewID;
  size_t j;
  size_t i;
  size_t incOffset;
  Aggregate *aggregate;
  size_t aggNo;
  size_t numberIncomingViews;
  TDNode *destRelation_1;
  View *view;
  size_t *viewID;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  TDNode *destRelation;
  TDNode *baseRelation;
  vector<bool,_std::allocator<bool>_> incViewBitset;
  var_bitset joinVars;
  size_t group;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffbf8;
  TreeDecomposition *in_stack_fffffffffffffc00;
  undefined6 in_stack_fffffffffffffc08;
  undefined1 in_stack_fffffffffffffc0e;
  byte in_stack_fffffffffffffc0f;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc10;
  size_type in_stack_fffffffffffffc18;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffc20;
  size_type in_stack_fffffffffffffc28;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc30;
  size_t local_300;
  size_type *local_278;
  size_type *local_250;
  size_type *local_228;
  reference local_1e8;
  ulong local_1d8;
  _Base_bitset<2UL> local_1d0;
  long local_1c0;
  byte local_1b1;
  View *local_1b0;
  ulong local_1a8;
  reference local_1a0;
  size_type local_198;
  ulong local_190;
  var_bitset *local_188;
  reference local_180;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_170;
  reference local_168;
  size_type local_160;
  reference local_158;
  ulong local_148;
  undefined8 local_140;
  undefined8 local_138;
  reference local_130;
  ulong local_120;
  reference local_118;
  _Base_bitset<2UL> local_108;
  reference local_f8;
  ulong local_f0;
  ulong local_e8;
  size_type local_e0;
  value_type local_d8;
  ulong local_d0;
  _Base_bitset<2UL> local_c8;
  size_t local_b8;
  TDNode *local_b0;
  View *local_a8;
  reference local_a0;
  unsigned_long *local_98;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  reference local_88;
  _Base_bitset<2UL> local_80;
  TDNode *local_70;
  TDNode *local_68;
  ulong local_10;
  
  computeViewOrdering(in_stack_00000140);
  sVar6 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xf0));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar6;
  uVar7 = SUB168(auVar1 * ZEXT816(0x18),0);
  uVar15 = uVar7 + 8;
  if (SUB168(auVar1 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar7) {
    uVar15 = 0xffffffffffffffff;
  }
  psVar8 = (size_type *)operator_new__(uVar15);
  *psVar8 = sVar6;
  psVar8 = psVar8 + 1;
  if (sVar6 != 0) {
    local_228 = psVar8;
    do {
      memset(local_228,0,0x18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x28268d);
      local_228 = local_228 + 3;
    } while (local_228 != psVar8 + sVar6 * 3);
  }
  *(size_type **)(in_RDI + 0xb8) = psVar8;
  sVar6 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xf0));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar6;
  uVar7 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar15 = uVar7 + 8;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar7) {
    uVar15 = 0xffffffffffffffff;
  }
  psVar8 = (size_type *)operator_new__(uVar15);
  *psVar8 = sVar6;
  psVar8 = psVar8 + 1;
  if (sVar6 != 0) {
    local_250 = psVar8;
    do {
      memset(local_250,0,0x18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x282776);
      local_250 = local_250 + 3;
    } while (local_250 != psVar8 + sVar6 * 3);
  }
  *(size_type **)(in_RDI + 0xc0) = psVar8;
  sVar6 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xf0));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar6;
  uVar7 = SUB168(auVar3 * ZEXT816(0x18),0);
  uVar15 = uVar7 + 8;
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar7) {
    uVar15 = 0xffffffffffffffff;
  }
  psVar8 = (size_type *)operator_new__(uVar15);
  *psVar8 = sVar6;
  psVar8 = psVar8 + 1;
  if (sVar6 != 0) {
    local_278 = psVar8;
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x28284b);
      local_278 = local_278 + 3;
    } while (local_278 != psVar8 + sVar6 * 3);
  }
  *(size_type **)(in_RDI + 200) = psVar8;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *)(in_RDI + 0xf0));
  std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::resize
            ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)
             in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  local_10 = 0;
  while( true ) {
    uVar7 = local_10;
    sVar6 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0xf0));
    if (sVar6 <= uVar7) break;
    std::bitset<100UL>::bitset((bitset<100UL> *)0x282901);
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x282912);
    QueryCompiler::numberOfViews((QueryCompiler *)0x28291a);
    std::allocator<bool>::allocator((allocator<bool> *)0x282937);
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_fffffffffffffc10,
               CONCAT17(in_stack_fffffffffffffc0f,
                        CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)),
               (allocator_type *)in_stack_fffffffffffffc00);
    std::allocator<bool>::~allocator((allocator<bool> *)0x282963);
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x282974);
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28298d);
    pvVar9 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0xf0),local_10);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar9,0);
    QueryCompiler::getView
              ((QueryCompiler *)in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8);
    local_68 = TreeDecomposition::getRelation
                         (in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8);
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x282a1c);
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x282a35);
    pvVar9 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)(in_RDI + 0xf0),local_10);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar9,0);
    QueryCompiler::getView
              ((QueryCompiler *)in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8);
    local_70 = TreeDecomposition::getRelation
                         (in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8);
    if (local_68->_id != local_70->_id) {
      local_80._M_w =
           (_WordT  [2])
           std::operator&((bitset<100UL> *)in_stack_fffffffffffffbf8,(bitset<100UL> *)0x282aee);
      std::bitset<100UL>::operator|=
                ((bitset<100UL> *)in_stack_fffffffffffffc00,
                 (bitset<100UL> *)in_stack_fffffffffffffbf8);
    }
    local_88 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             *)(in_RDI + 0xf0),local_10);
    local_90._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_fffffffffffffbf8);
    local_98 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         (in_stack_fffffffffffffbf8);
    while( true ) {
      bVar5 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffc00,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffbf8);
      if (!bVar5) break;
      local_a0 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_90);
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x282bf3);
      local_a8 = QueryCompiler::getView
                           ((QueryCompiler *)in_stack_fffffffffffffc00,
                            (size_t)in_stack_fffffffffffffbf8);
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x282c31);
      local_b0 = TreeDecomposition::getRelation
                           (in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8);
      if (local_a8->_origin == local_a8->_destination) {
        local_300 = local_68->_numOfNeighbors;
      }
      else {
        local_300 = local_68->_numOfNeighbors - 1;
      }
      local_b8 = local_300;
      if (local_300 == 0) {
        local_c8._M_w =
             (_WordT  [2])
             std::operator&((bitset<100UL> *)in_stack_fffffffffffffbf8,(bitset<100UL> *)0x282cde);
        std::bitset<100UL>::operator|=
                  ((bitset<100UL> *)in_stack_fffffffffffffc00,
                   (bitset<100UL> *)in_stack_fffffffffffffbf8);
      }
      else {
        local_d0 = 0;
        while( true ) {
          uVar7 = local_d0;
          sVar6 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size
                            (&local_a8->_aggregates);
          if (sVar6 <= uVar7) break;
          ppAVar10 = std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::operator[]
                               (&local_a8->_aggregates,local_d0);
          local_d8 = *ppAVar10;
          local_e0 = 0;
          local_e8 = 0;
          while( true ) {
            uVar7 = local_e8;
            sVar6 = std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::size
                              (&local_d8->_agg);
            if (sVar6 <= uVar7) break;
            for (local_f0 = 0; local_f0 < local_b8; local_f0 = local_f0 + 1) {
              local_f8 = std::
                         vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ::operator[](&local_d8->_incoming,local_e0);
              std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x282e0a);
              QueryCompiler::getView
                        ((QueryCompiler *)in_stack_fffffffffffffc00,
                         (size_t)in_stack_fffffffffffffbf8);
              local_108._M_w =
                   (_WordT  [2])
                   std::operator&((bitset<100UL> *)in_stack_fffffffffffffbf8,
                                  (bitset<100UL> *)0x282e44);
              std::bitset<100UL>::operator|=
                        ((bitset<100UL> *)in_stack_fffffffffffffc00,
                         (bitset<100UL> *)in_stack_fffffffffffffbf8);
              rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
              local_118 = rVar16;
              std::_Bit_reference::operator=(&local_118,true);
              local_e0 = local_e0 + 1;
            }
            local_e8 = local_e8 + 1;
          }
          local_d0 = local_d0 + 1;
        }
      }
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_90);
    }
    for (local_120 = 0; local_120 < 100; local_120 = local_120 + 1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)
                 CONCAT17(in_stack_fffffffffffffc0f,
                          CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)),
                 (size_t)in_stack_fffffffffffffc00);
      bVar5 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffc00);
      std::bitset<100UL>::reference::~reference(&local_130);
      if (bVar5) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffc10,
                   (value_type_conflict2 *)
                   CONCAT17(in_stack_fffffffffffffc0f,
                            CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)));
      }
    }
    sVar6 = std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::size((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    *)(in_RDI + 0xf0));
    if (sVar6 == 1) {
      local_138 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc00,
                 (value_type_conflict2 *)in_stack_fffffffffffffbf8);
    }
    std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::operator[]
              ((vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> *)(in_RDI + 0xd0),
               local_10);
    std::bitset<100UL>::operator|=
              ((bitset<100UL> *)in_stack_fffffffffffffc00,(bitset<100UL> *)in_stack_fffffffffffffbf8
              );
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (*(long *)(in_RDI + 0xb8) + local_10 * 0x18));
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2830c5);
    QueryCompiler::numberOfViews((QueryCompiler *)0x2830cd);
    local_140 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
               (value_type_conflict2 *)in_stack_fffffffffffffc20);
    local_148 = 0;
    while( true ) {
      uVar7 = local_148;
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         (*(long *)(in_RDI + 0xb8) + local_10 * 0x18));
      if (sVar6 <= uVar7) break;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 (*(long *)(in_RDI + 0xb8) + local_10 * 0x18),local_148);
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)
                 CONCAT17(in_stack_fffffffffffffc0f,
                          CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)),
                 (size_t)in_stack_fffffffffffffc00);
      bVar5 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffc00);
      std::bitset<100UL>::reference::~reference(&local_158);
      uVar7 = local_148;
      if (bVar5) {
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x28320e);
        sVar11 = QueryCompiler::numberOfViews((QueryCompiler *)0x283216);
        local_160 = uVar7 * (sVar11 + 2);
        local_168 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               (*(long *)(in_RDI + 200) + local_10 * 0x18),local_160);
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x283285);
        sVar11 = QueryCompiler::numberOfViews((QueryCompiler *)0x28328d);
        pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (*(long *)(in_RDI + 200) + local_10 * 0x18),local_160 + 1);
        *pvVar12 = sVar11;
        *local_168 = *local_168 + 1;
      }
      local_148 = local_148 + 1;
    }
    local_170 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
    while( true ) {
      pvVar4 = local_170;
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x283328);
      pvVar13 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                QueryCompiler::numberOfViews((QueryCompiler *)0x283330);
      if (pvVar13 <= pvVar4) break;
      rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      local_180 = rVar16;
      bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_180);
      if (bVar5) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffc10,
                   (value_type_conflict2 *)
                   CONCAT17(in_stack_fffffffffffffc0f,
                            CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)));
        std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x2833e3);
        pVVar14 = QueryCompiler::getView
                            ((QueryCompiler *)in_stack_fffffffffffffc00,
                             (size_t)in_stack_fffffffffffffbf8);
        local_188 = &pVVar14->_fVars;
        local_190 = 0;
        while( true ) {
          uVar7 = local_190;
          sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (*(long *)(in_RDI + 0xb8) + local_10 * 0x18));
          if (sVar6 <= uVar7) break;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     (*(long *)(in_RDI + 0xb8) + local_10 * 0x18),local_190);
          bVar5 = std::bitset<100UL>::operator[]
                            ((bitset<100UL> *)in_stack_fffffffffffffc00,
                             (size_t)in_stack_fffffffffffffbf8);
          uVar7 = local_190;
          if (bVar5) {
            std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2834cc);
            sVar11 = QueryCompiler::numberOfViews((QueryCompiler *)0x2834d4);
            local_198 = uVar7 * (sVar11 + 2);
            local_1a0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                   (*(long *)(in_RDI + 200) + local_10 * 0x18),local_198);
            in_stack_fffffffffffffc30 = local_170;
            pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 (*(long *)(in_RDI + 200) + local_10 * 0x18),
                                 local_198 + *local_1a0 + 1);
            *pvVar12 = (value_type)in_stack_fffffffffffffc30;
            *local_1a0 = *local_1a0 + 1;
          }
          local_190 = local_190 + 1;
        }
      }
      local_170 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                  ((long)&(local_170->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start + 1);
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x2835cb);
    local_10 = local_10 + 1;
  }
  std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2835f5);
  sVar11 = QueryCompiler::numberOfViews((QueryCompiler *)0x2835fd);
  __s = operator_new__(sVar11);
  memset(__s,0,sVar11);
  *(void **)(in_RDI + 0xe8) = __s;
  local_1a8 = 0;
  do {
    uVar7 = local_1a8;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x28365c);
    sVar11 = QueryCompiler::numberOfViews((QueryCompiler *)0x283664);
    if (sVar11 <= uVar7) {
      return;
    }
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x283686);
    local_1b0 = QueryCompiler::getView
                          ((QueryCompiler *)in_stack_fffffffffffffc00,
                           (size_t)in_stack_fffffffffffffbf8);
    local_1b1 = 0;
    local_1c0 = 0;
    std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2836d4);
    TreeDecomposition::getRelation(in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8);
    local_1d0._M_w =
         (_WordT  [2])
         std::operator&((bitset<100UL> *)in_stack_fffffffffffffbf8,(bitset<100UL> *)0x2836fa);
    for (local_1d8 = 0; local_1d8 < 100; local_1d8 = local_1d8 + 1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)
                 CONCAT17(in_stack_fffffffffffffc0f,
                          CONCAT16(in_stack_fffffffffffffc0e,in_stack_fffffffffffffc08)),
                 (size_t)in_stack_fffffffffffffc00);
      in_stack_fffffffffffffc0f =
           std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffc00);
      std::bitset<100UL>::reference::~reference(&local_1e8);
      if ((in_stack_fffffffffffffc0f & 1) != 0) {
        if (*(ulong *)(*(long *)(*(long *)(in_RDI + 0x108) + (ulong)local_1b0->_origin * 8) +
                      local_1c0 * 8) != local_1d8) {
          local_1b1 = 1;
          break;
        }
        local_1c0 = local_1c0 + 1;
      }
    }
    in_stack_fffffffffffffc0e = true;
    if ((local_1b1 & 1) == 0) {
      in_stack_fffffffffffffc00 = (TreeDecomposition *)&local_1b0->_fVars;
      std::bitset<100UL>::operator~
                ((bitset<100UL> *)
                 CONCAT17(in_stack_fffffffffffffc0f,CONCAT16(1,in_stack_fffffffffffffc08)));
      std::operator&((bitset<100UL> *)in_stack_fffffffffffffbf8,(bitset<100UL> *)0x283827);
      in_stack_fffffffffffffc0e = std::bitset<100UL>::any((bitset<100UL> *)0x283844);
    }
    *(undefined1 *)(*(long *)(in_RDI + 0xe8) + local_1a8) = in_stack_fffffffffffffc0e;
    local_1a8 = local_1a8 + 1;
  } while( true );
}

Assistant:

void CppGenerator::createGroupVariableOrder()
{
    computeViewOrdering();
    
    groupVariableOrder = new std::vector<size_t>[viewGroups.size()]();
    groupIncomingViews = new std::vector<size_t>[viewGroups.size()]();
    groupViewsPerVarInfo = new std::vector<size_t>[viewGroups.size()];

    groupVariableOrderBitset.resize(viewGroups.size());
    
    for (size_t group = 0; group < viewGroups.size(); ++group)
    {
        var_bitset joinVars;
        std::vector<bool> incViewBitset(_qc->numberOfViews());
        
        TDNode* baseRelation = _td->getRelation(
            _qc->getView(viewGroups[group][0])->_origin);

        // TODO:TODO: is it ok to add this in ?!??
        // we are adding the variables in the intersection with the destination
        TDNode* destRelation = _td->getRelation(
            _qc->getView(viewGroups[group][0])->_destination);

        if (baseRelation->_id != destRelation->_id)
            joinVars |= destRelation->_bag & baseRelation->_bag;

        for (const size_t& viewID : viewGroups[group])
        {
            View* view = _qc->getView(viewID);

            TDNode* destRelation = _td->getRelation(view->_destination);

            size_t numberIncomingViews =
                (view->_origin == view->_destination ? baseRelation->_numOfNeighbors :
                 baseRelation->_numOfNeighbors - 1);

            // if ther are not inc views we use the fVars as free variable
            if (numberIncomingViews == 0)
                joinVars |= (view->_fVars & destRelation->_bag);
            else
            {
                for (size_t aggNo = 0; aggNo < view->_aggregates.size(); ++aggNo)
                {
                    Aggregate* aggregate = view->_aggregates[aggNo];

                    size_t incOffset = 0;
                    // First find the all views that contribute to this Aggregate
                    for (size_t i = 0; i < aggregate->_agg.size(); ++i)
                    {
                        for (size_t j = 0; j < numberIncomingViews; j++)
                        {
                            const size_t& incViewID =
                                aggregate->_incoming[incOffset].first;


                            // TODO: TODO: TODO: MAKE SURE THAT YOU ALSO
                            // CONSIDER INTERSECTION OF FREE VARS THAT ARE
                            // SHARED B/W TWO VIEWS BUT NOT IN BAG
                            
                            // Add the intersection of the view and the base
                            // relation to joinVars
                            joinVars |= (_qc->getView(incViewID)->_fVars &
                                         baseRelation->_bag);
                            // Indicate that this view contributes to some aggregate
                            incViewBitset[incViewID] = 1;
                            ++incOffset;
                        }                        
                    }
                }
            }
        }

        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            if (joinVars[var])
                groupVariableOrder[group].push_back(var);

        if(viewGroups.size() == 1) {
            DINFO("There is only a single relation! \n"); 
            assert(groupVariableOrder[group].size() == 0);
            assert(destRelation->_bag[0]);
            groupVariableOrder[group].push_back(0);
        }


        groupVariableOrderBitset[group] |= joinVars;
        
        groupViewsPerVarInfo[group].resize(groupVariableOrder[group].size() *
                                       (_qc->numberOfViews() + 2), 0);

        // For each variable, check if the baseRelation contains this variable
        for (size_t var=0; var < groupVariableOrder[group].size(); ++var)
        {
            if (baseRelation->_bag[groupVariableOrder[group][var]])
            {
                size_t idx = var * (_qc->numberOfViews() + 2);
                size_t& off = groupViewsPerVarInfo[group][idx];
                groupViewsPerVarInfo[group][idx+1] = _qc->numberOfViews();
                ++off;
            }
        }

        // For each incoming view, check if it contains any vars from the
        // variable order and then add it to the corresponding info
        for (size_t incViewID=0; incViewID < _qc->numberOfViews(); ++incViewID)
        {
            if (incViewBitset[incViewID])
            {
                groupIncomingViews[group].push_back(incViewID);
                const var_bitset& viewFVars = _qc->getView(incViewID)->_fVars;
                    
                for (size_t var=0; var < groupVariableOrder[group].size(); ++var)
                {
                    if (viewFVars[groupVariableOrder[group][var]])
                    {
                        size_t idx = var * (_qc->numberOfViews() + 2);
                        size_t& off = groupViewsPerVarInfo[group][idx];
                        groupViewsPerVarInfo[group][idx+off+1] = incViewID;
                        ++off;
                    }
                }
            }
        }      
    }

    _requireHashing = new bool[_qc->numberOfViews()]();

    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        bool hash = false;
        size_t orderIdx = 0;
        
        var_bitset intersection = view->_fVars & _td->getRelation(view->_origin)->_bag;
        
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (intersection[var])
            {
                if (sortOrders[view->_origin][orderIdx] != var)
                {
                    hash = true;
                    break;
                }
                ++orderIdx;
            }
        }
        _requireHashing[viewID] = hash || (view->_fVars & ~intersection).any();
    }
}